

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  Message *pMVar1;
  Mutex *in_RDI;
  MutexLock lock;
  Descriptor *in_stack_000000f0;
  DynamicMessageFactory *in_stack_000000f8;
  MutexLock *in_stack_ffffffffffffffd0;
  
  internal::MutexLock::MutexLock(in_stack_ffffffffffffffd0,in_RDI);
  pMVar1 = GetPrototypeNoLock(in_stack_000000f8,in_stack_000000f0);
  internal::MutexLock::~MutexLock((MutexLock *)0x558644);
  return pMVar1;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototype(const Descriptor* type) {
  MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}